

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O1

void gl4cts::KHRDebug::cleanGroupStack(Functions *gl)

{
  deUint32 err;
  
  (*gl->popDebugGroup)();
  err = (*gl->getError)();
  while (err != 0x504) {
    glu::checkError(err,"PopDebugGroup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x5a);
    (*gl->popDebugGroup)();
    err = (*gl->getError)();
  }
  return;
}

Assistant:

void cleanGroupStack(const Functions* gl)
{
	while (1)
	{
		gl->popDebugGroup();

		const GLenum err = gl->getError();

		if (GL_STACK_UNDERFLOW == err)
		{
			break;
		}

		GLU_EXPECT_NO_ERROR(err, "PopDebugGroup");
	}
}